

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

QTextFrame * __thiscall QTextDocumentPrivate::frameAt(QTextDocumentPrivate *this,int pos)

{
  int iVar1;
  QTextFrame *this_00;
  uint uVar2;
  int iVar3;
  QTextFrame *this_01;
  int iVar4;
  long in_FS_OFFSET;
  QList<QTextFrame_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = rootFrame(this);
  do {
    this_01 = this_00;
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (QTextFrame **)&DAT_aaaaaaaaaaaaaaaa;
    QTextFrame::childFrames(&local_58,this_01);
    iVar4 = (int)local_58.d.size + -1;
    if (-1 < iVar4) {
      iVar3 = 0;
      do {
        uVar2 = (uint)(iVar3 + iVar4) >> 1;
        this_00 = local_58.d.ptr[uVar2];
        iVar1 = QTextFrame::lastPosition(this_00);
        if (iVar1 < pos) {
          iVar3 = uVar2 + 1;
        }
        else {
          iVar4 = QTextFrame::firstPosition(this_00);
          if (iVar4 <= pos) goto LAB_004d44c8;
          iVar4 = uVar2 - 1;
        }
      } while (iVar3 <= iVar4);
    }
    this_00 = (QTextFrame *)0x0;
LAB_004d44c8:
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (this_00 == (QTextFrame *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return this_01;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

QTextFrame *QTextDocumentPrivate::frameAt(int pos) const
{
    QTextFrame *f = rootFrame();

    while (1) {
        QTextFrame *c = findChildFrame(f, pos);
        if (!c)
            return f;
        f = c;
    }
}